

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan
               (Scanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  StringNew *pSVar5;
  ContBind *pCVar6;
  RefI31 *pRVar7;
  TableGet *pTVar8;
  CallRef *pCVar9;
  SIMDExtract *pSVar10;
  Call *pCVar11;
  ArrayInitData *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Switch *pSVar16;
  ArrayNew *pAVar17;
  Return *pRVar18;
  StructNew *pSVar19;
  BrOn *pBVar20;
  Suspend *pSVar21;
  Store *pSVar22;
  Throw *pTVar23;
  StringWTF16Get *pSVar24;
  ResumeThrow *pRVar25;
  TupleMake *pTVar26;
  ArrayNewFixed *pAVar27;
  StringEq *currp_00;
  PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *pPVar28;
  ulong uVar29;
  Break *pBVar30;
  StringConcat *currp_01;
  
  this = *currp;
  switch(*this) {
  case (Expression)0x0:
  case (Expression)0x60:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case (Expression)0x1:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)*(uint *)(pBVar1 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pBVar1 + 0x20),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x2:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitIf,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::If>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((If *)pSVar24 + 0x20));
    goto LAB_0012bd36;
  case (Expression)0x3:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoop,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0012b8b7;
  case (Expression)0x4:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBreak,currp);
    pBVar30 = Expression::cast<wasm::Break>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pBVar30 + 0x28));
    pBVar30 = pBVar30 + 0x20;
    goto LAB_0012b795;
  case (Expression)0x5:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSwitch,currp)
    ;
    pSVar16 = Expression::cast<wasm::Switch>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pSVar16 + 0x48));
    pBVar30 = (Break *)(pSVar16 + 0x40);
    goto LAB_0012b795;
  case (Expression)0x6:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)*(uint *)(pCVar11 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar11 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x7:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pCVar13 + 0x38));
    uVar29 = (ulong)*(uint *)(pCVar13 + 0x20);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar13 + 0x18),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x8:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case (Expression)0x9:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalSet,
               currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0012bb4b;
  case (Expression)0xa:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case (Expression)0xb:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalSet,
               currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0012b8b7;
  case (Expression)0xc:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    currp_01 = (StringConcat *)(pLVar14 + 0x30);
    goto LAB_0012bd4e;
  case (Expression)0xd:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_0012bb0e;
  case (Expression)0xe:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case (Expression)0xf:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnary,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_0012bb4b;
  case (Expression)0x10:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBinary,currp)
    ;
    pSVar5 = (StringNew *)Expression::cast<wasm::Binary>(this);
    goto LAB_0012baa8;
  case (Expression)0x11:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSelect,currp)
    ;
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::Select>(this);
    goto LAB_0012bd27;
  case (Expression)0x12:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDrop,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::Drop>(this);
    goto LAB_0012b958;
  case (Expression)0x13:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitReturn,currp)
    ;
    pRVar18 = Expression::cast<wasm::Return>(this);
    pBVar30 = (Break *)(pRVar18 + 0x10);
    goto LAB_0012b795;
  case (Expression)0x14:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case (Expression)0x15:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryGrow,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_0012b958;
  case (Expression)0x16:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case (Expression)0x17:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case (Expression)0x18:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0012bb96;
  case (Expression)0x19:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicCmpxchg
               ,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0012bb87;
  case (Expression)0x1a:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicWait,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0012b8db;
  case (Expression)0x1b:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicNotify,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0012baa8;
  case (Expression)0x1c:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case (Expression)0x1d:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar10 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0012bb4b;
  case (Expression)0x1e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDReplace,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = (StringEq *)((SIMDReplace *)pSVar5 + 0x28);
    goto LAB_0012bab6;
  case (Expression)0x1f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShuffle,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0012bd36;
  case (Expression)0x20:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDTernary,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0012b8db;
  case (Expression)0x21:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShift,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0012baa8;
  case (Expression)0x22:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDLoad,
               currp);
    pBVar20 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0012ba36;
  case (Expression)0x23:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0012bb0e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pSVar22 + 0x38));
    currp_01 = (StringConcat *)(pSVar22 + 0x30);
    goto LAB_0012bd4e;
  case (Expression)0x24:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryInit,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_0012bb87;
  case (Expression)0x25:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case (Expression)0x26:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0012bd27;
  case (Expression)0x27:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryFill,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0012bd27;
  case (Expression)0x28:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case (Expression)0x29:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefNull,currp
              );
    Expression::cast<wasm::RefNull>(this);
    return;
  case (Expression)0x2a:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefIsNull,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_0012b958;
  case (Expression)0x2b:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefFunc,currp
              );
    Expression::cast<wasm::RefFunc>(this);
    return;
  case (Expression)0x2c:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefEq,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0012bd36;
  case (Expression)0x2d:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGet,
               currp);
    pTVar8 = Expression::cast<wasm::TableGet>(this);
LAB_0012b8b7:
    currp_01 = (StringConcat *)(pTVar8 + 0x20);
    goto LAB_0012bd4e;
  case (Expression)0x2e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSet,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0012bb96;
  case (Expression)0x2f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case (Expression)0x30:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGrow,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_0012bb96;
  case (Expression)0x31:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableFill,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableFill>(this);
    goto LAB_0012bb87;
  case (Expression)0x32:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_0012bd27;
  case (Expression)0x33:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableInit,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableInit>(this);
    goto LAB_0012bb87;
  case (Expression)0x34:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)*(uint *)(pTVar15 + 0x50);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar15 + 0x48),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    currp_01 = (StringConcat *)(pTVar15 + 0x20);
    goto LAB_0012bd4e;
  case (Expression)0x35:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTryTable,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TryTable>(this);
    goto LAB_0012b958;
  case (Expression)0x36:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar23 + 0x20),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x37:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRethrow,currp
              );
    Expression::cast<wasm::Rethrow>(this);
    return;
  case (Expression)0x38:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrowRef,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_0012b958;
  case (Expression)0x39:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleMake,
               currp);
    pTVar26 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)*(uint *)(pTVar26 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar26 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x3a:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleExtract,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_0012b958;
  case (Expression)0x3b:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefI31,currp)
    ;
    pRVar7 = Expression::cast<wasm::RefI31>(this);
    goto LAB_0012b958;
  case (Expression)0x3c:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31Get,currp)
    ;
    pRVar7 = (RefI31 *)Expression::cast<wasm::I31Get>(this);
    goto LAB_0012b958;
  case (Expression)0x3d:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallRef,currp
              );
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pCVar9 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar9 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar9 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x3e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefTest,currp
              );
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefTest>(this);
    goto LAB_0012b958;
  case (Expression)0x3f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefCast,currp
              );
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefCast>(this);
    goto LAB_0012b958;
  case (Expression)0x40:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBrOn,currp);
    pBVar20 = Expression::cast<wasm::BrOn>(this);
LAB_0012ba36:
    currp_01 = (StringConcat *)(pBVar20 + 0x28);
    goto LAB_0012bd4e;
  case (Expression)0x41:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructNew,
               currp);
    pSVar19 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)*(uint *)(pSVar19 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar19 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x42:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructGet,
               currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_0012bb4b;
  case (Expression)0x43:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructSet,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructSet>(this);
    goto LAB_0012baa8;
  case (Expression)0x44:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructRMW,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_0012baa8;
  case (Expression)0x45:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructCmpxchg
               ,currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_0012b8db:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((StringEq *)pSVar5 + 0x28));
LAB_0012b8f4:
    currp_00 = (StringEq *)pSVar5 + 0x20;
    goto LAB_0012bab6;
  case (Expression)0x46:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNew,
               currp);
    pAVar17 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pAVar17 + 0x18));
    pBVar30 = (Break *)(pAVar17 + 0x10);
LAB_0012b795:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)pBVar30);
    return;
  case (Expression)0x47:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_0012bb96;
  case (Expression)0x48:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_0012bb96;
  case (Expression)0x49:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewFixed
               ,currp);
    pAVar27 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)*(uint *)(pAVar27 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pAVar27 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x4a:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayGet,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0012bd36;
  case (Expression)0x4b:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArraySet,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_0012bd27;
  case (Expression)0x4c:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayLen,
               currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_0012b958;
  case (Expression)0x4d:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((ArrayCopy *)pSVar24 + 0x30));
    goto LAB_0012bd18;
  case (Expression)0x4e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayFill,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayFill>(this);
LAB_0012bd18:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x28));
    goto LAB_0012bd27;
  case (Expression)0x4f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInitData
               ,currp);
    pAVar12 = Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_0012b3ad;
  case (Expression)0x50:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInitElem
               ,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_0012b3ad:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pAVar12 + 0x38));
LAB_0012bb87:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pAVar12 + 0x30));
LAB_0012bb96:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pAVar12 + 0x28));
    currp_01 = (StringConcat *)(pAVar12 + 0x20);
    goto LAB_0012bd4e;
  case (Expression)0x51:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefAs,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_0012bb4b;
  case (Expression)0x52:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringNew,
               currp);
    pSVar5 = Expression::cast<wasm::StringNew>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pSVar5 + 0x28));
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pSVar5 + 0x20));
    goto LAB_0012bac1;
  case (Expression)0x53:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case (Expression)0x54:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringMeasure
               ,currp);
    pSVar10 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
LAB_0012bb4b:
    currp_01 = (StringConcat *)(pSVar10 + 0x18);
    goto LAB_0012bd4e;
  case (Expression)0x55:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEncode,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StringEncode>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((StringEncode *)pSVar5 + 0x28));
    goto LAB_0012b8f4;
  case (Expression)0x56:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConcat,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0012bd36;
  case (Expression)0x57:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEq,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StringEq>(this);
LAB_0012baa8:
    currp_00 = (StringEq *)pSVar5 + 0x20;
LAB_0012bab6:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)currp_00);
LAB_0012bac1:
    currp_01 = (StringConcat *)((StringEq *)pSVar5 + 0x18);
    goto LAB_0012bd4e;
  case (Expression)0x58:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF16Get,currp);
    pSVar24 = Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0012bd36;
  case (Expression)0x59:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceWTF,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0012bd27:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x20));
LAB_0012bd36:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x18));
    currp_01 = (StringConcat *)pSVar24 + 0x10;
    goto LAB_0012bd4e;
  case (Expression)0x5a:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitContNew,currp
              );
    pRVar7 = (RefI31 *)Expression::cast<wasm::ContNew>(this);
LAB_0012b958:
    currp_01 = (StringConcat *)(pRVar7 + 0x10);
LAB_0012bd4e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
                ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)currp_01);
    return;
  case (Expression)0x5b:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitContBind,
               currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pCVar6 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x5c:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSuspend,currp
              );
    pSVar21 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)*(uint *)(pSVar21 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar21 + 0x20),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x5d:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitResume,currp)
    ;
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pRVar2 + 0x70));
    uVar29 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x5e:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitResumeThrow,
               currp);
    pRVar25 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pRVar25 + 0x80));
    uVar29 = (ulong)*(uint *)(pRVar25 + 0x68);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar25 + 0x60),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case (Expression)0x5f:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               ).super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,scan,
               (Expression **)(pSVar3 + 0x40));
    uVar29 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar29);
      Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                (&pPVar28->super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>,
                 scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }